

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_consumer.c
# Opt level: O3

amqp_rpc_reply_t *
amqp_read_message(amqp_rpc_reply_t *__return_storage_ptr__,amqp_connection_state_t state,
                 amqp_channel_t channel,amqp_message_t *message,int flags)

{
  amqp_bytes_t *paVar1;
  amqp_pool_t *pool;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  amqp_bytes_t aVar6;
  amqp_frame_t frame;
  amqp_frame_t local_60;
  
  (__return_storage_ptr__->reply).decoded = (void *)0x0;
  *(undefined8 *)&__return_storage_ptr__->library_error = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  *(undefined8 *)&__return_storage_ptr__->reply = 0;
  memset(message,0,0x118);
  iVar2 = amqp_simple_wait_frame_on_channel(state,channel,&local_60);
  if (iVar2 != 0) {
    __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    __return_storage_ptr__->library_error = iVar2;
    return __return_storage_ptr__;
  }
  if (local_60.frame_type != '\x02') {
    if ((local_60.frame_type == '\x01') &&
       ((local_60.payload.method.id == 0x140028 || (local_60.payload.method.id == 0xa0032)))) {
      __return_storage_ptr__->reply_type = AMQP_RESPONSE_SERVER_EXCEPTION;
      *(ulong *)&__return_storage_ptr__->reply =
           CONCAT44(local_60.payload.body_fragment.len._4_4_,local_60.payload.method.id);
      (__return_storage_ptr__->reply).decoded = local_60.payload.method.decoded;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    __return_storage_ptr__->library_error = -0x10;
    amqp_put_back_frame(state,&local_60);
    return __return_storage_ptr__;
  }
  pool = &message->pool;
  init_amqp_pool(pool,0x1000);
  memset(message,0,200);
  uVar3 = *local_60.payload.properties.decoded;
  (message->properties)._flags = uVar3;
  if ((short)uVar3 < 0) {
    paVar1 = &(message->properties).content_type;
    if (*(size_t *)((long)local_60.payload.properties.decoded + 8) == 0) {
      paVar1->len = 0;
      (message->properties).content_type.bytes = (void *)0x0;
      goto LAB_0010c2ee;
    }
    amqp_pool_alloc_bytes(pool,*(size_t *)((long)local_60.payload.properties.decoded + 8),paVar1);
    pvVar4 = (message->properties).content_type.bytes;
    if (pvVar4 != (void *)0x0) {
      memcpy(pvVar4,*(void **)((long)local_60.payload.properties.decoded + 0x10),
             (message->properties).content_type.len);
      uVar3 = (message->properties)._flags;
      goto LAB_0010c2ee;
    }
  }
  else {
LAB_0010c2ee:
    if ((uVar3 >> 0xe & 1) != 0) {
      paVar1 = &(message->properties).content_encoding;
      if (*(size_t *)((long)local_60.payload.properties.decoded + 0x18) == 0) {
        paVar1->len = 0;
        (message->properties).content_encoding.bytes = (void *)0x0;
      }
      else {
        amqp_pool_alloc_bytes
                  (pool,*(size_t *)((long)local_60.payload.properties.decoded + 0x18),paVar1);
        pvVar4 = (message->properties).content_encoding.bytes;
        if (pvVar4 == (void *)0x0) goto LAB_0010c5da;
        memcpy(pvVar4,*(void **)((long)local_60.payload.properties.decoded + 0x20),
               (message->properties).content_encoding.len);
        uVar3 = (message->properties)._flags;
      }
    }
    if ((uVar3 >> 0xd & 1) != 0) {
      iVar2 = amqp_table_clone((amqp_table_t *)((long)local_60.payload.properties.decoded + 0x28),
                               &(message->properties).headers,pool);
      if (iVar2 != 0) goto LAB_0010c5df;
      uVar3 = (message->properties)._flags;
    }
    if ((uVar3 >> 0xc & 1) != 0) {
      (message->properties).delivery_mode =
           *(uint8_t *)((long)local_60.payload.properties.decoded + 0x38);
    }
    if ((uVar3 >> 0xb & 1) != 0) {
      (message->properties).priority =
           *(uint8_t *)((long)local_60.payload.properties.decoded + 0x39);
    }
    if ((uVar3 >> 10 & 1) != 0) {
      paVar1 = &(message->properties).correlation_id;
      if (*(size_t *)((long)local_60.payload.properties.decoded + 0x40) == 0) {
        paVar1->len = 0;
        (message->properties).correlation_id.bytes = (void *)0x0;
      }
      else {
        amqp_pool_alloc_bytes
                  (pool,*(size_t *)((long)local_60.payload.properties.decoded + 0x40),paVar1);
        pvVar4 = (message->properties).correlation_id.bytes;
        if (pvVar4 == (void *)0x0) goto LAB_0010c5da;
        memcpy(pvVar4,*(void **)((long)local_60.payload.properties.decoded + 0x48),
               (message->properties).correlation_id.len);
        uVar3 = (message->properties)._flags;
      }
    }
    if ((uVar3 >> 9 & 1) != 0) {
      paVar1 = &(message->properties).reply_to;
      if (*(size_t *)((long)local_60.payload.properties.decoded + 0x50) == 0) {
        paVar1->len = 0;
        (message->properties).reply_to.bytes = (void *)0x0;
      }
      else {
        amqp_pool_alloc_bytes
                  (pool,*(size_t *)((long)local_60.payload.properties.decoded + 0x50),paVar1);
        pvVar4 = (message->properties).reply_to.bytes;
        if (pvVar4 == (void *)0x0) goto LAB_0010c5da;
        memcpy(pvVar4,*(void **)((long)local_60.payload.properties.decoded + 0x58),
               (message->properties).reply_to.len);
        uVar3 = (message->properties)._flags;
      }
    }
    if ((uVar3 >> 8 & 1) != 0) {
      paVar1 = &(message->properties).expiration;
      if (*(size_t *)((long)local_60.payload.properties.decoded + 0x60) == 0) {
        paVar1->len = 0;
        (message->properties).expiration.bytes = (void *)0x0;
      }
      else {
        amqp_pool_alloc_bytes
                  (pool,*(size_t *)((long)local_60.payload.properties.decoded + 0x60),paVar1);
        pvVar4 = (message->properties).expiration.bytes;
        if (pvVar4 == (void *)0x0) goto LAB_0010c5da;
        memcpy(pvVar4,*(void **)((long)local_60.payload.properties.decoded + 0x68),
               (message->properties).expiration.len);
        uVar3 = (message->properties)._flags;
      }
    }
    if ((char)uVar3 < '\0') {
      paVar1 = &(message->properties).message_id;
      if (*(size_t *)((long)local_60.payload.properties.decoded + 0x70) == 0) {
        paVar1->len = 0;
        (message->properties).message_id.bytes = (void *)0x0;
      }
      else {
        amqp_pool_alloc_bytes
                  (pool,*(size_t *)((long)local_60.payload.properties.decoded + 0x70),paVar1);
        pvVar4 = (message->properties).message_id.bytes;
        if (pvVar4 == (void *)0x0) goto LAB_0010c5da;
        memcpy(pvVar4,*(void **)((long)local_60.payload.properties.decoded + 0x78),
               (message->properties).message_id.len);
        uVar3 = (message->properties)._flags;
      }
    }
    if ((uVar3 & 0x40) != 0) {
      (message->properties).timestamp =
           *(uint64_t *)((long)local_60.payload.properties.decoded + 0x80);
    }
    if ((uVar3 & 0x20) != 0) {
      paVar1 = &(message->properties).type;
      if (*(size_t *)((long)local_60.payload.properties.decoded + 0x88) == 0) {
        paVar1->len = 0;
        (message->properties).type.bytes = (void *)0x0;
      }
      else {
        amqp_pool_alloc_bytes
                  (pool,*(size_t *)((long)local_60.payload.properties.decoded + 0x88),paVar1);
        pvVar4 = (message->properties).type.bytes;
        if (pvVar4 == (void *)0x0) goto LAB_0010c5da;
        memcpy(pvVar4,*(void **)((long)local_60.payload.properties.decoded + 0x90),
               (message->properties).type.len);
        uVar3 = (message->properties)._flags;
      }
    }
    if ((uVar3 & 0x10) != 0) {
      paVar1 = &(message->properties).user_id;
      if (*(size_t *)((long)local_60.payload.properties.decoded + 0x98) == 0) {
        paVar1->len = 0;
        (message->properties).user_id.bytes = (void *)0x0;
      }
      else {
        amqp_pool_alloc_bytes
                  (pool,*(size_t *)((long)local_60.payload.properties.decoded + 0x98),paVar1);
        pvVar4 = (message->properties).user_id.bytes;
        if (pvVar4 == (void *)0x0) goto LAB_0010c5da;
        memcpy(pvVar4,*(void **)((long)local_60.payload.properties.decoded + 0xa0),
               (message->properties).user_id.len);
        uVar3 = (message->properties)._flags;
      }
    }
    if ((uVar3 & 8) != 0) {
      paVar1 = &(message->properties).app_id;
      if (*(size_t *)((long)local_60.payload.properties.decoded + 0xa8) == 0) {
        paVar1->len = 0;
        (message->properties).app_id.bytes = (void *)0x0;
      }
      else {
        amqp_pool_alloc_bytes
                  (pool,*(size_t *)((long)local_60.payload.properties.decoded + 0xa8),paVar1);
        pvVar4 = (message->properties).app_id.bytes;
        if (pvVar4 == (void *)0x0) goto LAB_0010c5da;
        memcpy(pvVar4,*(void **)((long)local_60.payload.properties.decoded + 0xb0),
               (message->properties).app_id.len);
        uVar3 = (message->properties)._flags;
      }
    }
    if ((uVar3 & 4) == 0) {
LAB_0010c60f:
      if (local_60.payload.method.decoded == (void *)0x0) {
        (message->body).len = 0;
        (message->body).bytes = (void *)0x0;
        aVar6 = message->body;
      }
      else {
        aVar6 = amqp_bytes_malloc(local_60.payload.properties.body_size);
        message->body = aVar6;
        if (aVar6.bytes == (void *)0x0) {
          __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
          __return_storage_ptr__->library_error = -1;
          return __return_storage_ptr__;
        }
      }
      pvVar4 = aVar6.bytes;
      if (aVar6.len != 0) {
        uVar5 = 0;
        do {
          iVar2 = amqp_simple_wait_frame_on_channel(state,channel,&local_60);
          if (iVar2 != 0) {
            __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
            __return_storage_ptr__->library_error = iVar2;
LAB_0010c73e:
            amqp_bytes_free(message->body);
            goto LAB_0010c5e8;
          }
          if (local_60.frame_type != '\x03') {
            if ((local_60.frame_type == '\x01') &&
               ((local_60.payload.method.id == 0x140028 || (local_60.payload.method.id == 0xa0032)))
               ) {
              __return_storage_ptr__->reply_type = AMQP_RESPONSE_SERVER_EXCEPTION;
              *(ulong *)&__return_storage_ptr__->reply =
                   CONCAT44(local_60.payload.body_fragment.len._4_4_,local_60.payload.method.id);
              (__return_storage_ptr__->reply).decoded = local_60.payload.method.decoded;
            }
            else {
              __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
              __return_storage_ptr__->library_error = -2;
            }
            goto LAB_0010c73e;
          }
          if ((message->body).len <
              CONCAT44(local_60.payload.body_fragment.len._4_4_,local_60.payload.method.id) + uVar5)
          {
            __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
            __return_storage_ptr__->library_error = -2;
            goto LAB_0010c73e;
          }
          memcpy(pvVar4,local_60.payload.method.decoded,
                 CONCAT44(local_60.payload.body_fragment.len._4_4_,local_60.payload.method.id));
          uVar5 = uVar5 + CONCAT44(local_60.payload.body_fragment.len._4_4_,
                                   local_60.payload.method.id);
          pvVar4 = (void *)((long)pvVar4 +
                           CONCAT44(local_60.payload.body_fragment.len._4_4_,
                                    local_60.payload.method.id));
        } while (uVar5 < (message->body).len);
      }
      __return_storage_ptr__->reply_type = AMQP_RESPONSE_NORMAL;
      return __return_storage_ptr__;
    }
    paVar1 = &(message->properties).cluster_id;
    if (*(size_t *)((long)local_60.payload.properties.decoded + 0xb8) == 0) {
      paVar1->len = 0;
      (message->properties).cluster_id.bytes = (void *)0x0;
      goto LAB_0010c60f;
    }
    amqp_pool_alloc_bytes(pool,*(size_t *)((long)local_60.payload.properties.decoded + 0xb8),paVar1)
    ;
    pvVar4 = (message->properties).cluster_id.bytes;
    if (pvVar4 != (void *)0x0) {
      memcpy(pvVar4,*(void **)((long)local_60.payload.properties.decoded + 0xc0),paVar1->len);
      goto LAB_0010c60f;
    }
  }
LAB_0010c5da:
  iVar2 = -1;
LAB_0010c5df:
  __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
  __return_storage_ptr__->library_error = iVar2;
LAB_0010c5e8:
  empty_amqp_pool(pool);
  return __return_storage_ptr__;
}

Assistant:

amqp_rpc_reply_t amqp_read_message(amqp_connection_state_t state,
                                   amqp_channel_t channel,
                                   amqp_message_t *message,
                                   AMQP_UNUSED int flags)
{
  amqp_frame_t frame;
  amqp_rpc_reply_t ret;

  size_t body_read;
  char *body_read_ptr;
  int res;

  memset(&ret, 0, sizeof(amqp_rpc_reply_t));
  memset(message, 0, sizeof(amqp_message_t));

  res = amqp_simple_wait_frame_on_channel(state, channel, &frame);
  if (AMQP_STATUS_OK != res) {
    ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    ret.library_error = res;

    goto error_out1;
  }

  if (AMQP_FRAME_HEADER != frame.frame_type) {
    if (AMQP_FRAME_METHOD == frame.frame_type &&
        (AMQP_CHANNEL_CLOSE_METHOD == frame.payload.method.id ||
         AMQP_CONNECTION_CLOSE_METHOD == frame.payload.method.id)) {

      ret.reply_type = AMQP_RESPONSE_SERVER_EXCEPTION;
      ret.reply = frame.payload.method;

    } else {
      ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
      ret.library_error = AMQP_STATUS_UNEXPECTED_STATE;

      amqp_put_back_frame(state, &frame);
    }
    goto error_out1;
  }

  init_amqp_pool(&message->pool, 4096);
  res = amqp_basic_properties_clone(frame.payload.properties.decoded,
                                    &message->properties, &message->pool);

  if (AMQP_STATUS_OK != res) {
    ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    ret.library_error = res;
    goto error_out3;
  }

  if (0 == frame.payload.properties.body_size) {
    message->body = amqp_empty_bytes;
  } else {
    message->body = amqp_bytes_malloc(frame.payload.properties.body_size);
    if (NULL == message->body.bytes) {
      ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
      ret.library_error = AMQP_STATUS_NO_MEMORY;
      goto error_out1;
    }
  }

  body_read = 0;
  body_read_ptr = message->body.bytes;

  while (body_read < message->body.len) {
    res = amqp_simple_wait_frame_on_channel(state, channel, &frame);
    if (AMQP_STATUS_OK != res) {
      ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
      ret.library_error = res;
      goto error_out2;
    }
    if (AMQP_FRAME_BODY != frame.frame_type) {
      if (AMQP_FRAME_METHOD == frame.frame_type &&
          (AMQP_CHANNEL_CLOSE_METHOD == frame.payload.method.id ||
           AMQP_CONNECTION_CLOSE_METHOD == frame.payload.method.id)) {

        ret.reply_type = AMQP_RESPONSE_SERVER_EXCEPTION;
        ret.reply = frame.payload.method;
      } else {
        ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
        ret.library_error = AMQP_STATUS_BAD_AMQP_DATA;
      }
      goto error_out2;
    }

    if (body_read + frame.payload.body_fragment.len > message->body.len) {
      ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
      ret.library_error = AMQP_STATUS_BAD_AMQP_DATA;
      goto error_out2;
    }

    memcpy(body_read_ptr, frame.payload.body_fragment.bytes, frame.payload.body_fragment.len);

    body_read += frame.payload.body_fragment.len;
    body_read_ptr += frame.payload.body_fragment.len;
  }

  ret.reply_type = AMQP_RESPONSE_NORMAL;
  return ret;

error_out2:
  amqp_bytes_free(message->body);
error_out3:
  empty_amqp_pool(&message->pool);
error_out1:
  return ret;
}